

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_get_record_expansion(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_transform *pmVar1;
  mbedtls_cipher_info_t *pmVar2;
  uint uVar3;
  int iVar4;
  mbedtls_cipher_mode_t mVar5;
  
  pmVar1 = ssl->transform_out;
  if (pmVar1 == (mbedtls_ssl_transform *)0x0) {
    return (uint)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 5;
  }
  pmVar2 = (pmVar1->cipher_ctx_enc).cipher_info;
  if (pmVar2 == (mbedtls_cipher_info_t *)0x0) {
    mVar5 = MBEDTLS_MODE_NONE;
  }
  else {
    mVar5 = pmVar2->mode;
  }
  if (mVar5 - MBEDTLS_MODE_GCM < 3) {
    iVar4 = (int)pmVar1->minlen;
  }
  else {
    if (mVar5 != MBEDTLS_MODE_CBC) {
      return -0x6c00;
    }
    if (pmVar2 == (mbedtls_cipher_info_t *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = pmVar2->block_size;
    }
    iVar4 = uVar3 + (int)pmVar1->maclen;
  }
  return iVar4 + (uint)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 5;
}

Assistant:

int mbedtls_ssl_get_record_expansion( const mbedtls_ssl_context *ssl )
{
    size_t transform_expansion;
    const mbedtls_ssl_transform *transform = ssl->transform_out;

#if defined(MBEDTLS_ZLIB_SUPPORT)
    if( ssl->session_out->compression != MBEDTLS_SSL_COMPRESS_NULL )
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
#endif

    if( transform == NULL )
        return( (int) mbedtls_ssl_hdr_len( ssl ) );

    switch( mbedtls_cipher_get_cipher_mode( &transform->cipher_ctx_enc ) )
    {
        case MBEDTLS_MODE_GCM:
        case MBEDTLS_MODE_CCM:
        case MBEDTLS_MODE_STREAM:
            transform_expansion = transform->minlen;
            break;

        case MBEDTLS_MODE_CBC:
            transform_expansion = transform->maclen
                      + mbedtls_cipher_get_block_size( &transform->cipher_ctx_enc );
            break;

        default:
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    return( (int)( mbedtls_ssl_hdr_len( ssl ) + transform_expansion ) );
}